

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dr_wav.h
# Opt level: O3

drwav_int16 *
drwav_open_memory_and_read_pcm_frames_s16
          (void *data,size_t dataSize,uint *channelsOut,uint *sampleRateOut,
          drwav_uint64 *totalFrameCountOut)

{
  drwav_int16 *pdVar1;
  uint channels;
  uint sampleRate;
  drwav_uint64 totalSampleCount;
  uint local_28;
  uint local_24;
  ulong local_20;
  
  if (channelsOut != (uint *)0x0) {
    *channelsOut = 0;
  }
  if (sampleRateOut != (uint *)0x0) {
    *sampleRateOut = 0;
  }
  if (totalFrameCountOut != (drwav_uint64 *)0x0) {
    *totalFrameCountOut = 0;
  }
  pdVar1 = drwav_open_memory_and_read_s16(data,dataSize,&local_28,&local_24,&local_20);
  if (pdVar1 != (drwav_int16 *)0x0) {
    if (channelsOut != (uint *)0x0) {
      *channelsOut = local_28;
    }
    if (sampleRateOut != (uint *)0x0) {
      *sampleRateOut = local_24;
    }
    if (totalFrameCountOut != (drwav_uint64 *)0x0) {
      *totalFrameCountOut = local_20 / local_28;
    }
  }
  return pdVar1;
}

Assistant:

drwav_int16* drwav_open_memory_and_read_pcm_frames_s16(const void* data, size_t dataSize, unsigned int* channelsOut, unsigned int* sampleRateOut, drwav_uint64* totalFrameCountOut)
{
    if (channelsOut) *channelsOut = 0;
    if (sampleRateOut) *sampleRateOut = 0;
    if (totalFrameCountOut) *totalFrameCountOut = 0;

    unsigned int channels;
    unsigned int sampleRate;
    drwav_uint64 totalSampleCount;
    drwav_int16* result = drwav_open_memory_and_read_s16(data, dataSize, &channels, &sampleRate, &totalSampleCount);
    if (result == NULL) {
        return NULL;
    }

    if (channelsOut) *channelsOut = channels;
    if (sampleRateOut) *sampleRateOut = sampleRate;
    if (totalFrameCountOut) *totalFrameCountOut = totalSampleCount / channels;

    return result;
}